

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::StartsWithOperator,bool,true,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char **ppcVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  idx_t iVar13;
  ulong uVar14;
  bool bVar15;
  char **local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  bool *local_60;
  string_t *local_58;
  ulong local_50;
  ulong local_48;
  unsigned_long *local_40;
  ulong local_38;
  
  local_40 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_60 = result_data;
  local_58 = ldata;
  local_48 = count;
  if (local_40 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = *(undefined8 *)&ldata->value;
      pcVar12 = (ldata->value).pointer.ptr;
      local_88 = &(rdata->value).pointer.ptr;
      iVar13 = 0;
      local_40 = (unsigned_long *)0x0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_88 + -1);
        local_80._0_4_ = paVar1->length;
        local_80._4_1_ = paVar1->prefix[0];
        local_80._5_1_ = paVar1->prefix[1];
        local_80._6_1_ = paVar1->prefix[2];
        local_80._7_1_ = paVar1->prefix[3];
        uVar5 = (uint)uVar3;
        pcVar11 = pcVar12;
        if (uVar5 < 0xd) {
          pcVar11 = (char *)((long)&local_70 + 4);
        }
        local_78 = *local_88;
        pcVar10 = local_78;
        if ((local_80 & 0xffffffff) < 0xd) {
          pcVar10 = (char *)((long)&local_80 + 4);
        }
        if ((local_80 & 0xffffffff) == 0) {
          bVar15 = true;
        }
        else if (uVar5 < (uint)(undefined4)local_80) {
          bVar15 = false;
        }
        else {
          local_70 = uVar3;
          local_68 = pcVar12;
          iVar4 = bcmp(pcVar11,pcVar10,local_80 & 0xffffffff);
          bVar15 = iVar4 == 0;
          result_data = local_60;
        }
        result_data[iVar13] = bVar15;
        iVar13 = iVar13 + 1;
        local_88 = local_88 + 2;
      } while (local_48 != iVar13);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_38 = 0;
    uVar6 = 0;
    do {
      uVar2 = local_40[local_38];
      uVar14 = uVar6 + 0x40;
      if (local_48 <= uVar6 + 0x40) {
        uVar14 = local_48;
      }
      uVar7 = uVar14;
      if (uVar2 != 0) {
        uVar7 = uVar6;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar6 < uVar14) {
            uVar3 = *(undefined8 *)&local_58->value;
            pcVar12 = (local_58->value).pointer.ptr;
            ppcVar8 = &rdata[uVar6].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar8 + -1);
              local_80._0_4_ = paVar1->length;
              local_80._4_1_ = paVar1->prefix[0];
              local_80._5_1_ = paVar1->prefix[1];
              local_80._6_1_ = paVar1->prefix[2];
              local_80._7_1_ = paVar1->prefix[3];
              uVar5 = (uint)uVar3;
              pcVar11 = pcVar12;
              if (uVar5 < 0xd) {
                pcVar11 = (char *)((long)&local_70 + 4);
              }
              local_78 = *ppcVar8;
              pcVar10 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pcVar10 = (char *)((long)&local_80 + 4);
              }
              if ((local_80 & 0xffffffff) == 0) {
                bVar15 = true;
              }
              else if (uVar5 < (uint)(undefined4)local_80) {
                bVar15 = false;
              }
              else {
                local_70 = uVar3;
                local_68 = pcVar12;
                iVar4 = bcmp(pcVar11,pcVar10,local_80 & 0xffffffff);
                bVar15 = iVar4 == 0;
                result_data = local_60;
              }
              result_data[uVar6] = bVar15;
              uVar6 = uVar6 + 1;
              ppcVar8 = ppcVar8 + 2;
              uVar7 = uVar6;
            } while (uVar14 != uVar6);
          }
        }
        else if (uVar6 < uVar14) {
          ppcVar8 = &rdata[uVar6].value.pointer.ptr;
          uVar9 = 0;
          do {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              local_70 = *(undefined8 *)&local_58->value;
              local_68 = (local_58->value).pointer.ptr;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar8 + -1);
              local_80._0_4_ = paVar1->length;
              local_80._4_1_ = paVar1->prefix[0];
              local_80._5_1_ = paVar1->prefix[1];
              local_80._6_1_ = paVar1->prefix[2];
              local_80._7_1_ = paVar1->prefix[3];
              local_78 = *ppcVar8;
              pcVar12 = local_68;
              if ((uint)local_70 < 0xd) {
                pcVar12 = (char *)((long)&local_70 + 4);
              }
              pcVar11 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pcVar11 = (char *)((long)&local_80 + 4);
              }
              if ((local_80 & 0xffffffff) == 0) {
                bVar15 = true;
              }
              else if ((uint)local_70 < (uint)(undefined4)local_80) {
                bVar15 = false;
              }
              else {
                iVar4 = bcmp(pcVar12,pcVar11,local_80 & 0xffffffff);
                bVar15 = iVar4 == 0;
                result_data = local_60;
              }
              result_data[uVar6] = bVar15;
            }
            uVar6 = uVar6 + 1;
            ppcVar8 = ppcVar8 + 2;
            uVar9 = uVar9 + 1;
            uVar7 = uVar6;
          } while (uVar14 != uVar6);
        }
      }
      local_38 = local_38 + 1;
      uVar6 = uVar7;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}